

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.h
# Opt level: O0

float haarY(integral_image *iimage,int row,int col,int s)

{
  float fVar1;
  float fVar2;
  int in_stack_00000050;
  int in_stack_00000054;
  int in_stack_00000058;
  int in_stack_0000005c;
  integral_image *in_stack_00000060;
  
  fVar1 = box_integral(in_stack_00000060,in_stack_0000005c,in_stack_00000058,in_stack_00000054,
                       in_stack_00000050);
  fVar2 = box_integral(in_stack_00000060,in_stack_0000005c,in_stack_00000058,in_stack_00000054,
                       in_stack_00000050);
  return fVar1 - fVar2;
}

Assistant:

inline float haarY(struct integral_image *iimage, int row, int col, int s) {
    return box_integral(iimage, row, col-s/2, s/2, s) - box_integral(iimage, row-s/2, col-s/2, s/2, s); // 1 x add + 2 x box_integral(3 x add + 1 x fmax) => Total: 7 x add + 2 x fmax
}